

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O1

Vec_Bit_t * Sbc_ManCriticalPath(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Bit_t *vPath;
  int *__s;
  Vec_Int_t *pVVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int *pLevels;
  int *local_38;
  
  local_38 = (int *)0x0;
  if (p->pManTime == (void *)0x0) {
    iVar2 = Gia_ManLutLevel(p,&local_38);
  }
  else {
    iVar2 = Gia_ManLutLevelWithBoxes(p);
  }
  iVar5 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  vPath = (Vec_Bit_t *)malloc(0x10);
  vPath->nSize = 0;
  vPath->nCap = iVar5 * 0x20;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 * 4);
  }
  vPath->pArray = __s;
  vPath->nSize = iVar5 * 0x20;
  memset(__s,0,(long)iVar5 << 2);
  if (p->pManTime != (void *)0x0) {
    local_38 = p->vLevels->pArray;
  }
  Gia_ManIncrementTravId(p);
  pVVar3 = p->vCos;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      uVar1 = pVVar3->pArray[lVar6];
      if (((long)(int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = *(uint *)(p->pObjs + (int)uVar1) & 0x1fffffff;
      iVar5 = uVar1 - uVar4;
      if ((local_38[iVar5] == iVar2) && (uVar1 != uVar4)) {
        Sbc_ManCriticalPath_rec(p,local_38,iVar5,local_38[iVar5],vPath,1);
      }
      lVar6 = lVar6 + 1;
      pVVar3 = p->vCos;
    } while (lVar6 < pVVar3->nSize);
  }
  if (local_38 != (int *)0x0 && p->pManTime == (void *)0x0) {
    free(local_38);
    local_38 = (int *)0x0;
  }
  Sbc_ManAddInternalToPath(p,vPath);
  return vPath;
}

Assistant:

Vec_Bit_t * Sbc_ManCriticalPath( Gia_Man_t * p )
{
    int * pLevels = NULL, k, iDriver, Slack = 1;
    int nLevels = p->pManTime ? Gia_ManLutLevelWithBoxes(p) : Gia_ManLutLevel(p, &pLevels);
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    if ( p->pManTime )
        pLevels = Vec_IntArray( p->vLevels );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriverId( p, iDriver, k )
        if ( (pLevels[iDriver] == nLevels) && iDriver )
            Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Slack );
    if ( !p->pManTime )
        ABC_FREE( pLevels );
    Sbc_ManAddInternalToPath( p, vPath );
    return vPath;
}